

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRewrite.c
# Opt level: O0

int main(int ArgC,char **ArgV)

{
  bool bVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *local_68;
  char *outputJsonString;
  JlDataObject *jsonObject;
  size_t errorAtPos;
  ulong uStack_48;
  JL_STATUS jlStatus;
  JL_OUTPUT_FLAGS outputFlags;
  char *inputJsonString;
  char *pcStack_30;
  _Bool success;
  char *inputFilename;
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  _Bool help;
  _Bool outputJson5;
  _Bool outputSingleQuote;
  _Bool outputBare;
  _Bool outputComma;
  _Bool outputHex;
  _Bool outputIndent;
  _Bool outputAscii;
  int result;
  char **ArgV_local;
  int ArgC_local;
  
  ArgV_local._4_4_ = 0;
  _help = 0;
  _outputComma = ArgV;
  ArgV_local._0_4_ = ArgC;
  local_1d = ParseCommandLineBoolArg((int *)&ArgV_local,(char ***)&outputComma,"-a","--ascii");
  local_1e = ParseCommandLineBoolArg((int *)&ArgV_local,(char ***)&outputComma,"-i","--indent");
  local_1f = ParseCommandLineBoolArg((int *)&ArgV_local,(char ***)&outputComma,"-x","--hex");
  local_20 = ParseCommandLineBoolArg((int *)&ArgV_local,(char ***)&outputComma,"-c","--comma");
  inputFilename._7_1_ =
       ParseCommandLineBoolArg((int *)&ArgV_local,(char ***)&outputComma,"-b","--bare");
  inputFilename._6_1_ =
       ParseCommandLineBoolArg((int *)&ArgV_local,(char ***)&outputComma,"-s","--singlequote");
  inputFilename._5_1_ =
       ParseCommandLineBoolArg((int *)&ArgV_local,(char ***)&outputComma,"-5","--json5");
  inputFilename._4_1_ =
       ParseCommandLineBoolArg((int *)&ArgV_local,(char ***)&outputComma,"-h","--help");
  _Var2 = ParseCommandLineBoolArg((int *)&ArgV_local,(char ***)&outputComma,"/h","/?");
  bVar1 = (inputFilename._4_1_ & 1) != 0;
  inputFilename._4_1_ = bVar1 || _Var2;
  if (((int)ArgV_local != 2) || (bVar1 || _Var2)) {
    printf(
          "Syntax:\n  JsonRewrite [options] <JsonFile>\n   options:\n       -a, --ascii       - Escape all non ascii in output\n       -i, --indent      - Apply indent formatting to output\n       -x, --hex         - Allow hex in output (Json5)\n       -b, --bare        - Allow bare keywords in dictionaries (Json5)\n       -s, --singlequote - Use single quotes instead od doubles for strings (Json5)\n       -c, --comma       - Put in trailing commas (Json5)\n       -5, --json5       - Combines --hex --bare --singlequote\n\n"
          );
    _help = 1;
  }
  else {
    pcStack_30 = _outputComma[1];
    outputFlags = 0;
    uVar3 = 0;
    if ((local_1e & 1) != 0) {
      uVar3 = 2;
    }
    uVar4 = 0;
    if ((local_1f & 1) != 0) {
      uVar4 = 0x20;
    }
    uVar5 = 0;
    if ((local_20 & 1) != 0) {
      uVar5 = 0x10;
    }
    uVar6 = 0;
    if ((inputFilename._7_1_ & 1) != 0) {
      uVar6 = 4;
    }
    uVar7 = 0;
    if ((inputFilename._6_1_ & 1) != 0) {
      uVar7 = 8;
    }
    uStack_48 = 0;
    if ((inputFilename._5_1_ & 1) != 0) {
      uStack_48 = 0x2c;
    }
    uStack_48 = (local_1d & 1) != 0 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uStack_48;
    inputJsonString._7_1_ = ReadFileIntoMemory(pcStack_30,(char **)&outputFlags);
    if ((bool)inputJsonString._7_1_) {
      jsonObject = (JlDataObject *)0x0;
      outputJsonString = (char *)0x0;
      errorAtPos._4_4_ =
           JlParseJson((char *)outputFlags,(JlDataObject **)&outputJsonString,(size_t *)&jsonObject)
      ;
      if (errorAtPos._4_4_ == JL_STATUS_SUCCESS) {
        local_68 = (char *)0x0;
        errorAtPos._4_4_ = JlOutputJsonEx((JlDataObject *)outputJsonString,uStack_48,&local_68);
        if (errorAtPos._4_4_ == JL_STATUS_SUCCESS) {
          printf("%s",local_68);
          JlFreeJsonStringBuffer(&local_68);
        }
        else {
          printf("Failed to output json\n");
          _help = 4;
        }
        JlFreeObjectTree((JlDataObject **)&outputJsonString);
      }
      else {
        printf("Failed to parse json in file: %s Position: %u\n",pcStack_30,
               (ulong)jsonObject & 0xffffffff);
        _help = 3;
      }
      free((void *)outputFlags);
    }
    else {
      printf("Failed to read file: %s\n",pcStack_30);
      _help = 2;
    }
  }
  return _help;
}

Assistant:

int
main
    (
        int     ArgC,
        char**  ArgV
    )
{
    int result = 0;

    bool outputAscii = ParseCommandLineBoolArg( &ArgC, &ArgV, "-a", "--ascii" );
    bool outputIndent = ParseCommandLineBoolArg( &ArgC, &ArgV, "-i", "--indent" );
    bool outputHex = ParseCommandLineBoolArg( &ArgC, &ArgV, "-x", "--hex" );
    bool outputComma = ParseCommandLineBoolArg( &ArgC, &ArgV, "-c", "--comma" );
    bool outputBare = ParseCommandLineBoolArg( &ArgC, &ArgV, "-b", "--bare" );
    bool outputSingleQuote = ParseCommandLineBoolArg( &ArgC, &ArgV, "-s", "--singlequote" );
    bool outputJson5 = ParseCommandLineBoolArg( &ArgC, &ArgV, "-5", "--json5" );
    bool help = ParseCommandLineBoolArg( &ArgC, &ArgV, "-h", "--help" );
    help |= ParseCommandLineBoolArg( &ArgC, &ArgV, "/h", "/?" );

    if( 2 != ArgC || help )
    {
        printf(
            "Syntax:\n"
            "  JsonRewrite [options] <JsonFile>\n"
            "   options:\n"
            "       -a, --ascii       - Escape all non ascii in output\n"
            "       -i, --indent      - Apply indent formatting to output\n"
            "       -x, --hex         - Allow hex in output (Json5)\n"
            "       -b, --bare        - Allow bare keywords in dictionaries (Json5)\n"
            "       -s, --singlequote - Use single quotes instead od doubles for strings (Json5)\n"
            "       -c, --comma       - Put in trailing commas (Json5)\n"
            "       -5, --json5       - Combines --hex --bare --singlequote\n"
            "\n" );
        result = 1;
    }
    else
    {
        char const* inputFilename = ArgV[1];
        bool success;
        char* inputJsonString = NULL;

        // Create output option flags.
        JL_OUTPUT_FLAGS outputFlags =
                ( outputAscii ? JL_OUTPUT_FLAGS_ASCII : 0 )
            |   ( outputIndent ? JL_OUTPUT_FLAGS_INDENT : 0 )
            |   ( outputHex ? JL_OUTPUT_FLAGS_J5_ALLOW_HEX : 0 )
            |   ( outputComma ? JL_OUTPUT_FLAGS_J5_TRAILING_COMMAS : 0 )
            |   ( outputBare ? JL_OUTPUT_FLAGS_J5_USE_BARE_KEYWORDS : 0 )
            |   ( outputSingleQuote ? JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES : 0 )
            |   ( outputJson5 ? JL_OUTPUT_FLAGS_JSON5 : 0 );

        success = ReadFileIntoMemory( inputFilename, &inputJsonString );
        if( success )
        {
            JL_STATUS jlStatus;
            size_t errorAtPos = 0;
            JlDataObject* jsonObject = NULL;

            jlStatus = JlParseJson( inputJsonString, &jsonObject, &errorAtPos );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                char* outputJsonString = NULL;
                jlStatus = JlOutputJsonEx( jsonObject, outputFlags, &outputJsonString );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    // Print out the new formatted Json.
                    printf( "%s", outputJsonString );

                    JlFreeJsonStringBuffer( &outputJsonString );
                }
                else
                {
                    printf( "Failed to output json\n" );
                    result = 4;
                }

                JlFreeObjectTree( &jsonObject );
            }
            else
            {
                printf( "Failed to parse json in file: %s Position: %u\n", inputFilename, (uint32_t)errorAtPos );
                result = 3;
            }

            free( inputJsonString );
        }
        else
        {
            printf( "Failed to read file: %s\n", inputFilename );
            result = 2;
        }

    }

    return result;
}